

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

ini_section * __thiscall xray_re::xr_ini_file::r_section(xr_ini_file *this,char *sname)

{
  ini_section *piVar1;
  int iVar2;
  __normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  _Var3;
  
  _Var3 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section*const*,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                    ((__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<xray_re::xr_ini_file::ini_section_*const_*,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                      )(this->m_sections).
                       super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(ini_section_pred)sname);
  if (_Var3._M_current !=
      (this->m_sections).
      super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar1 = *_Var3._M_current;
    iVar2 = strcasecmp((piVar1->name)._M_dataplus._M_p,sname);
    if (iVar2 == 0) {
      return piVar1;
    }
  }
  msg("can\'t find section %s",sname);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x35,
                "const xr_ini_file::ini_section *xray_re::xr_ini_file::r_section(const char *) const"
               );
}

Assistant:

const xr_ini_file::ini_section* xr_ini_file::r_section(const char* sname) const
{
	ini_section_vec_cit it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(sname));
	if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), sname) != 0) {
		msg("can't find section %s", sname);
		xr_not_expected();
	}
	return *it;
}